

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O3

void ssh2_terminal_size(ConnectionLayer *cl,int width,int height)

{
  *(int *)((long)&cl[-0xb].vt + 4) = width;
  *(int *)&cl[-10].logctx = height;
  if (cl[-0xc].logctx == (LogContext *)0x0) {
    return;
  }
  return;
}

Assistant:

static void ssh2_terminal_size(ConnectionLayer *cl, int width, int height)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);

    s->term_width = width;
    s->term_height = height;
    if (s->mainchan)
        mainchan_terminal_size(s->mainchan, width, height);
}